

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86_fma::forward_inplace
          (Scale_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [12];
  uint uVar23;
  reference pvVar24;
  reference pvVar25;
  undefined8 *puVar26;
  int iVar27;
  undefined1 (*pauVar28) [32];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  __m128 _p_14;
  __m128 _s128_1;
  __m256 _p_13;
  __m256 _s256_1;
  int j_7;
  float s_3;
  float *ptr_12;
  int i_13;
  __m128 _p_12;
  __m128 _bias128;
  __m128 _s128;
  __m256 _p_11;
  __m256 _bias256;
  __m256 _s256;
  int j_6;
  float s_2;
  float *ptr_11;
  int i_12;
  int size_4;
  __m256 _p_10;
  __m256 _s_10;
  int j_5;
  float s_1;
  float *ptr_10;
  int i_11;
  __m256 _p_9;
  __m256 _bias_5;
  __m256 _s_9;
  int j_4;
  float bias_1;
  float s;
  float *ptr_9;
  int i_10;
  int size_3;
  __m128 _p_8;
  int i_9;
  __m128 _s_8;
  float *ptr_8;
  int q_3;
  __m128 _p_7;
  int i_8;
  __m128 _bias_4;
  __m128 _s_7;
  float *ptr_7;
  int q_2;
  int size_2;
  __m128 _p_6;
  int j_3;
  __m128 _s_6;
  float *ptr_6;
  int i_7;
  __m128 _p_5;
  int j_2;
  __m128 _bias_3;
  __m128 _s_5;
  float *ptr_5;
  int i_6;
  __m256 _p_4;
  int i_5;
  __m256 _s_4;
  float *ptr_4;
  int q_1;
  __m256 _p_3;
  int i_4;
  __m256 _bias_2;
  __m256 _s_3;
  float *ptr_3;
  int q;
  int size_1;
  __m256 _p_2;
  int j_1;
  __m256 _s_2;
  float *ptr_2;
  int i_3;
  __m256 _p_1;
  int j;
  __m256 _bias_1;
  __m256 _s_1;
  float *ptr_1;
  int i_2;
  int i_1;
  __m256 _bias;
  __m256 _s;
  __m256 _p;
  int i;
  int nn;
  int remain;
  int size;
  float *ptr;
  float *bias;
  float *scale;
  int elempack;
  int dims;
  int channels;
  int h;
  int w;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  int local_19f0;
  float *local_19a0;
  int local_1994;
  undefined8 local_1990;
  undefined8 uStack_1988;
  undefined8 local_1960;
  undefined8 uStack_1958;
  int local_1900;
  undefined1 (*local_18b0) [32];
  int local_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  int local_1858;
  float *local_1850;
  int local_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  int local_17dc;
  undefined1 (*local_17d0) [32];
  int local_17c8;
  float fStack_17b4;
  int local_17a4;
  undefined1 (*local_1740) [12];
  int local_1734;
  undefined8 local_1730;
  undefined8 uStack_1728;
  int local_1714;
  undefined8 *local_16a0;
  int local_1698;
  float fStack_1684;
  int local_1674;
  undefined1 (*local_1660) [12];
  int local_1654;
  undefined8 local_1650;
  undefined8 uStack_1648;
  int local_1634;
  undefined8 *local_1610;
  int local_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  int local_15c4;
  undefined8 *local_1550;
  int local_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  int local_1504;
  undefined1 (*local_1450) [32];
  int local_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  int local_1404;
  undefined8 *local_13d0;
  int local_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  int local_1384;
  undefined1 (*local_1330) [32];
  int local_1328;
  int local_1324;
  undefined1 local_12e0 [8];
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  int local_12c0;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  undefined4 uStack_f04;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  undefined4 uStack_ec4;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  undefined4 uStack_e84;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  undefined4 uStack_e44;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  undefined4 uStack_e04;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float local_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float local_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  pvVar24 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar25 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar27 = pvVar24->w;
  iVar4 = pvVar24->h;
  iVar5 = pvVar24->c;
  iVar6 = pvVar24->dims;
  iVar7 = pvVar24->elempack;
  pvVar8 = pvVar25->data;
  lVar9 = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120);
  if (iVar6 == 1) {
    pvVar10 = pvVar24->data;
    uVar23 = iVar27 * iVar7;
    for (local_12c0 = 0; local_12c0 < (int)uVar23 >> 3; local_12c0 = local_12c0 + 1) {
      auVar18 = *(undefined1 (*) [32])((long)pvVar10 + (long)(local_12c0 << 3) * 4);
      pauVar28 = (undefined1 (*) [32])((long)pvVar8 + (long)(local_12c0 << 3) * 4);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        local_e20 = auVar18._0_4_;
        fStack_e1c = auVar18._4_4_;
        fStack_e18 = auVar18._8_4_;
        fStack_e14 = auVar18._12_4_;
        fStack_e10 = auVar18._16_4_;
        fStack_e0c = auVar18._20_4_;
        fStack_e08 = auVar18._24_4_;
        uStack_e04 = auVar18._28_4_;
        local_e40 = (float)*(undefined8 *)*pauVar28;
        fStack_e3c = (float)((ulong)*(undefined8 *)*pauVar28 >> 0x20);
        fStack_e38 = (float)*(undefined8 *)(*pauVar28 + 8);
        fStack_e34 = (float)((ulong)*(undefined8 *)(*pauVar28 + 8) >> 0x20);
        fStack_e30 = (float)*(undefined8 *)(*pauVar28 + 0x10);
        fStack_e2c = (float)((ulong)*(undefined8 *)(*pauVar28 + 0x10) >> 0x20);
        fStack_e28 = (float)*(undefined8 *)(*pauVar28 + 0x18);
        local_12e0._4_4_ = fStack_e1c * fStack_e3c;
        local_12e0._0_4_ = local_e20 * local_e40;
        uStack_12d8._0_4_ = fStack_e18 * fStack_e38;
        uStack_12d8._4_4_ = fStack_e14 * fStack_e34;
        uStack_12d0._0_4_ = fStack_e10 * fStack_e30;
        uStack_12d0._4_4_ = fStack_e0c * fStack_e2c;
        uStack_12c8._0_4_ = fStack_e08 * fStack_e28;
        uStack_12c8._4_4_ = uStack_e04;
      }
      else {
        auVar13 = vfmadd213ps_fma(*pauVar28,auVar18,
                                  *(undefined1 (*) [32])(lVar9 + (long)(local_12c0 << 3) * 4));
        _local_12e0 = ZEXT1632(auVar13);
      }
      puVar26 = (undefined8 *)((long)pvVar10 + (long)(local_12c0 << 3) * 4);
      *puVar26 = local_12e0;
      puVar26[1] = uStack_12d8;
      puVar26[2] = uStack_12d0;
      puVar26[3] = uStack_12c8;
    }
    for (local_1324 = uVar23 - (uVar23 & 7); local_1324 < (int)uVar23; local_1324 = local_1324 + 1)
    {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        *(float *)((long)pvVar10 + (long)local_1324 * 4) =
             *(float *)((long)pvVar10 + (long)local_1324 * 4) *
             *(float *)((long)pvVar8 + (long)local_1324 * 4);
      }
      else {
        *(float *)((long)pvVar10 + (long)local_1324 * 4) =
             *(float *)((long)pvVar10 + (long)local_1324 * 4) *
             *(float *)((long)pvVar8 + (long)local_1324 * 4) +
             *(float *)(lVar9 + (long)local_1324 * 4);
      }
    }
  }
  else if (iVar7 == 8) {
    if (iVar6 == 2) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_13c4 = 0; local_13c4 < iVar4; local_13c4 = local_13c4 + 1) {
          local_13d0 = (undefined8 *)
                       ((long)pvVar24->data +
                       (long)pvVar24->w * (long)local_13c4 * pvVar24->elemsize);
          puVar26 = (undefined8 *)((long)pvVar25->data + (long)(local_13c4 << 3) * 4);
          uVar14 = *puVar26;
          uVar15 = puVar26[1];
          uVar16 = puVar26[2];
          uVar17 = puVar26[3];
          for (local_1404 = 0; local_1404 < iVar27; local_1404 = local_1404 + 1) {
            local_e60 = (float)*local_13d0;
            fStack_e5c = (float)((ulong)*local_13d0 >> 0x20);
            fStack_e58 = (float)local_13d0[1];
            fStack_e54 = (float)((ulong)local_13d0[1] >> 0x20);
            fStack_e50 = (float)local_13d0[2];
            fStack_e4c = (float)((ulong)local_13d0[2] >> 0x20);
            fStack_e48 = (float)local_13d0[3];
            uStack_e44 = (undefined4)((ulong)local_13d0[3] >> 0x20);
            local_e80 = (float)uVar14;
            fStack_e7c = (float)((ulong)uVar14 >> 0x20);
            fStack_e78 = (float)uVar15;
            fStack_e74 = (float)((ulong)uVar15 >> 0x20);
            fStack_e70 = (float)uVar16;
            fStack_e6c = (float)((ulong)uVar16 >> 0x20);
            fStack_e68 = (float)uVar17;
            local_1440 = CONCAT44(fStack_e5c * fStack_e7c,local_e60 * local_e80);
            uStack_1438 = CONCAT44(fStack_e54 * fStack_e74,fStack_e58 * fStack_e78);
            uStack_1430 = CONCAT44(fStack_e4c * fStack_e6c,fStack_e50 * fStack_e70);
            uStack_1428 = CONCAT44(uStack_e44,fStack_e48 * fStack_e68);
            *local_13d0 = local_1440;
            local_13d0[1] = uStack_1438;
            local_13d0[2] = uStack_1430;
            local_13d0[3] = uStack_1428;
            local_13d0 = local_13d0 + 4;
          }
        }
      }
      else {
        for (local_1328 = 0; local_1328 < iVar4; local_1328 = local_1328 + 1) {
          local_1330 = (undefined1 (*) [32])
                       ((long)pvVar24->data +
                       (long)pvVar24->w * (long)local_1328 * pvVar24->elemsize);
          auVar18 = *(undefined1 (*) [32])((long)pvVar25->data + (long)(local_1328 << 3) * 4);
          auVar19 = *(undefined1 (*) [32])
                     (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                     (long)(local_1328 << 3) * 4);
          for (local_1384 = 0; local_1384 < iVar27; local_1384 = local_1384 + 1) {
            auVar13 = vfmadd213ps_fma(auVar18,*local_1330,auVar19);
            local_13c0 = auVar13._0_8_;
            uStack_13b8 = auVar13._8_8_;
            *(undefined8 *)*local_1330 = local_13c0;
            *(undefined8 *)(*local_1330 + 8) = uStack_13b8;
            *(undefined8 *)(*local_1330 + 0x10) = 0;
            *(undefined8 *)(*local_1330 + 0x18) = 0;
            local_1330 = local_1330 + 1;
          }
        }
      }
    }
    if (iVar6 == 3) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_1544 = 0; local_1544 < iVar5; local_1544 = local_1544 + 1) {
          local_1550 = (undefined8 *)
                       ((long)pvVar24->data + pvVar24->cstep * (long)local_1544 * pvVar24->elemsize)
          ;
          puVar26 = (undefined8 *)((long)pvVar25->data + (long)(local_1544 << 3) * 4);
          uVar14 = *puVar26;
          uVar15 = puVar26[1];
          uVar16 = puVar26[2];
          uVar17 = puVar26[3];
          for (local_15c4 = 0; local_15c4 < iVar27 * iVar4; local_15c4 = local_15c4 + 1) {
            local_ea0 = (float)*local_1550;
            fStack_e9c = (float)((ulong)*local_1550 >> 0x20);
            fStack_e98 = (float)local_1550[1];
            fStack_e94 = (float)((ulong)local_1550[1] >> 0x20);
            fStack_e90 = (float)local_1550[2];
            fStack_e8c = (float)((ulong)local_1550[2] >> 0x20);
            fStack_e88 = (float)local_1550[3];
            uStack_e84 = (undefined4)((ulong)local_1550[3] >> 0x20);
            local_ec0 = (float)uVar14;
            fStack_ebc = (float)((ulong)uVar14 >> 0x20);
            fStack_eb8 = (float)uVar15;
            fStack_eb4 = (float)((ulong)uVar15 >> 0x20);
            fStack_eb0 = (float)uVar16;
            fStack_eac = (float)((ulong)uVar16 >> 0x20);
            fStack_ea8 = (float)uVar17;
            local_1600 = CONCAT44(fStack_e9c * fStack_ebc,local_ea0 * local_ec0);
            uStack_15f8 = CONCAT44(fStack_e94 * fStack_eb4,fStack_e98 * fStack_eb8);
            uStack_15f0 = CONCAT44(fStack_e8c * fStack_eac,fStack_e90 * fStack_eb0);
            uStack_15e8 = CONCAT44(uStack_e84,fStack_e88 * fStack_ea8);
            *local_1550 = local_1600;
            local_1550[1] = uStack_15f8;
            local_1550[2] = uStack_15f0;
            local_1550[3] = uStack_15e8;
            local_1550 = local_1550 + 4;
          }
        }
      }
      else {
        for (local_1448 = 0; local_1448 < iVar5; local_1448 = local_1448 + 1) {
          local_1450 = (undefined1 (*) [32])
                       ((long)pvVar24->data + pvVar24->cstep * (long)local_1448 * pvVar24->elemsize)
          ;
          auVar18 = *(undefined1 (*) [32])((long)pvVar25->data + (long)(local_1448 << 3) * 4);
          auVar19 = *(undefined1 (*) [32])
                     (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                     (long)(local_1448 << 3) * 4);
          for (local_1504 = 0; local_1504 < iVar27 * iVar4; local_1504 = local_1504 + 1) {
            auVar13 = vfmadd213ps_fma(auVar18,*local_1450,auVar19);
            local_1540 = auVar13._0_8_;
            uStack_1538 = auVar13._8_8_;
            *(undefined8 *)*local_1450 = local_1540;
            *(undefined8 *)(*local_1450 + 8) = uStack_1538;
            *(undefined8 *)(*local_1450 + 0x10) = 0;
            *(undefined8 *)(*local_1450 + 0x18) = 0;
            local_1450 = local_1450 + 1;
          }
        }
      }
    }
  }
  else {
    if (iVar7 == 4) {
      if (iVar6 == 2) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_1654 = 0; local_1654 < iVar4; local_1654 = local_1654 + 1) {
            local_1660 = (undefined1 (*) [12])
                         ((long)pvVar24->data +
                         (long)pvVar24->w * (long)local_1654 * pvVar24->elemsize);
            puVar26 = (undefined8 *)((long)pvVar25->data + (long)(local_1654 << 2) * 4);
            uVar14 = *puVar26;
            uVar15 = puVar26[1];
            for (local_1674 = 0; local_1674 < iVar27; local_1674 = local_1674 + 1) {
              auVar22 = *local_1660;
              fStack_1684 = (float)((ulong)*(undefined8 *)(*local_1660 + 8) >> 0x20);
              local_940 = auVar22._0_4_;
              fStack_93c = auVar22._4_4_;
              fStack_938 = auVar22._8_4_;
              local_950 = (float)uVar14;
              fStack_94c = (float)((ulong)uVar14 >> 0x20);
              fStack_948 = (float)uVar15;
              fStack_944 = (float)((ulong)uVar15 >> 0x20);
              *(ulong *)*local_1660 = CONCAT44(fStack_93c * fStack_94c,local_940 * local_950);
              *(ulong *)(*local_1660 + 8) =
                   CONCAT44(fStack_1684 * fStack_944,fStack_938 * fStack_948);
              local_1660 = (undefined1 (*) [12])(local_1660[1] + 4);
            }
          }
        }
        else {
          for (local_1604 = 0; local_1604 < iVar4; local_1604 = local_1604 + 1) {
            local_1610 = (undefined8 *)
                         ((long)pvVar24->data +
                         (long)pvVar24->w * (long)local_1604 * pvVar24->elemsize);
            puVar26 = (undefined8 *)((long)pvVar25->data + (long)(local_1604 << 2) * 4);
            uVar14 = *puVar26;
            uVar15 = puVar26[1];
            puVar26 = (undefined8 *)
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                      (long)(local_1604 << 2) * 4);
            uVar16 = *puVar26;
            uVar17 = puVar26[1];
            for (local_1634 = 0; local_1634 < iVar27; local_1634 = local_1634 + 1) {
              local_920 = (float)*local_1610;
              fStack_91c = (float)((ulong)*local_1610 >> 0x20);
              fStack_918 = (float)local_1610[1];
              fStack_914 = (float)((ulong)local_1610[1] >> 0x20);
              local_930 = (float)uVar14;
              fStack_92c = (float)((ulong)uVar14 >> 0x20);
              fStack_928 = (float)uVar15;
              fStack_924 = (float)((ulong)uVar15 >> 0x20);
              local_9d0 = (float)uVar16;
              fStack_9cc = (float)((ulong)uVar16 >> 0x20);
              fStack_9c8 = (float)uVar17;
              fStack_9c4 = (float)((ulong)uVar17 >> 0x20);
              local_1650 = CONCAT44(fStack_91c * fStack_92c + fStack_9cc,
                                    local_920 * local_930 + local_9d0);
              uStack_1648 = CONCAT44(fStack_914 * fStack_924 + fStack_9c4,
                                     fStack_918 * fStack_928 + fStack_9c8);
              *local_1610 = local_1650;
              local_1610[1] = uStack_1648;
              local_1610 = local_1610 + 2;
            }
          }
        }
      }
      if (iVar6 == 3) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_1734 = 0; local_1734 < iVar5; local_1734 = local_1734 + 1) {
            local_1740 = (undefined1 (*) [12])
                         ((long)pvVar24->data +
                         pvVar24->cstep * (long)local_1734 * pvVar24->elemsize);
            puVar26 = (undefined8 *)((long)pvVar25->data + (long)(local_1734 << 2) * 4);
            uVar14 = *puVar26;
            uVar15 = puVar26[1];
            for (local_17a4 = 0; local_17a4 < iVar27 * iVar4; local_17a4 = local_17a4 + 1) {
              auVar22 = *local_1740;
              fStack_17b4 = (float)((ulong)*(undefined8 *)(*local_1740 + 8) >> 0x20);
              local_980 = auVar22._0_4_;
              fStack_97c = auVar22._4_4_;
              fStack_978 = auVar22._8_4_;
              local_990 = (float)uVar14;
              fStack_98c = (float)((ulong)uVar14 >> 0x20);
              fStack_988 = (float)uVar15;
              fStack_984 = (float)((ulong)uVar15 >> 0x20);
              *(ulong *)*local_1740 = CONCAT44(fStack_97c * fStack_98c,local_980 * local_990);
              *(ulong *)(*local_1740 + 8) =
                   CONCAT44(fStack_17b4 * fStack_984,fStack_978 * fStack_988);
              local_1740 = (undefined1 (*) [12])(local_1740[1] + 4);
            }
          }
        }
        else {
          for (local_1698 = 0; local_1698 < iVar5; local_1698 = local_1698 + 1) {
            local_16a0 = (undefined8 *)
                         ((long)pvVar24->data +
                         pvVar24->cstep * (long)local_1698 * pvVar24->elemsize);
            puVar26 = (undefined8 *)((long)pvVar25->data + (long)(local_1698 << 2) * 4);
            uVar14 = *puVar26;
            uVar15 = puVar26[1];
            puVar26 = (undefined8 *)
                      (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                      (long)(local_1698 << 2) * 4);
            uVar16 = *puVar26;
            uVar17 = puVar26[1];
            for (local_1714 = 0; local_1714 < iVar27 * iVar4; local_1714 = local_1714 + 1) {
              local_960 = (float)*local_16a0;
              fStack_95c = (float)((ulong)*local_16a0 >> 0x20);
              fStack_958 = (float)local_16a0[1];
              fStack_954 = (float)((ulong)local_16a0[1] >> 0x20);
              local_970 = (float)uVar14;
              fStack_96c = (float)((ulong)uVar14 >> 0x20);
              fStack_968 = (float)uVar15;
              fStack_964 = (float)((ulong)uVar15 >> 0x20);
              local_9f0 = (float)uVar16;
              fStack_9ec = (float)((ulong)uVar16 >> 0x20);
              fStack_9e8 = (float)uVar17;
              fStack_9e4 = (float)((ulong)uVar17 >> 0x20);
              local_1730 = CONCAT44(fStack_95c * fStack_96c + fStack_9ec,
                                    local_960 * local_970 + local_9f0);
              uStack_1728 = CONCAT44(fStack_954 * fStack_964 + fStack_9e4,
                                     fStack_958 * fStack_968 + fStack_9e8);
              *local_16a0 = local_1730;
              local_16a0[1] = uStack_1728;
              local_16a0 = local_16a0 + 2;
            }
          }
        }
      }
    }
    if (iVar7 == 1) {
      if (iVar6 == 2) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_1844 = 0; local_1844 < iVar4; local_1844 = local_1844 + 1) {
            local_1850 = (float *)((long)pvVar24->data +
                                  (long)pvVar24->w * (long)local_1844 * pvVar24->elemsize);
            fVar1 = *(float *)((long)pvVar25->data + (long)local_1844 * 4);
            local_1858 = 0;
            auVar13 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar1),0x20);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar1),0x30);
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x30);
            for (; local_1858 + 7 < iVar27; local_1858 = local_1858 + 8) {
              local_ee0 = (float)*(undefined8 *)local_1850;
              fStack_edc = (float)((ulong)*(undefined8 *)local_1850 >> 0x20);
              fStack_ed8 = (float)*(undefined8 *)(local_1850 + 2);
              fStack_ed4 = (float)((ulong)*(undefined8 *)(local_1850 + 2) >> 0x20);
              fStack_ed0 = (float)*(undefined8 *)(local_1850 + 4);
              fStack_ecc = (float)((ulong)*(undefined8 *)(local_1850 + 4) >> 0x20);
              fStack_ec8 = (float)*(undefined8 *)(local_1850 + 6);
              uStack_ec4 = (undefined4)((ulong)*(undefined8 *)(local_1850 + 6) >> 0x20);
              local_f00 = auVar11._0_4_;
              fStack_efc = auVar11._4_4_;
              fStack_ef8 = auVar11._8_4_;
              fStack_ef4 = auVar11._12_4_;
              fStack_ef0 = auVar13._0_4_;
              fStack_eec = auVar13._4_4_;
              fStack_ee8 = auVar13._8_4_;
              local_18a0 = CONCAT44(fStack_edc * fStack_efc,local_ee0 * local_f00);
              uStack_1898 = CONCAT44(fStack_ed4 * fStack_ef4,fStack_ed8 * fStack_ef8);
              uStack_1890 = CONCAT44(fStack_ecc * fStack_eec,fStack_ed0 * fStack_ef0);
              uStack_1888 = CONCAT44(uStack_ec4,fStack_ec8 * fStack_ee8);
              *(undefined8 *)local_1850 = local_18a0;
              *(undefined8 *)(local_1850 + 2) = uStack_1898;
              *(undefined8 *)(local_1850 + 4) = uStack_1890;
              *(undefined8 *)(local_1850 + 6) = uStack_1888;
              local_1850 = local_1850 + 8;
            }
            for (; local_1858 < iVar27; local_1858 = local_1858 + 1) {
              *local_1850 = fVar1 * *local_1850;
              local_1850 = local_1850 + 1;
            }
          }
        }
        else {
          for (local_17c8 = 0; local_17c8 < iVar4; local_17c8 = local_17c8 + 1) {
            local_17d0 = (undefined1 (*) [32])
                         ((long)pvVar24->data +
                         (long)pvVar24->w * (long)local_17c8 * pvVar24->elemsize);
            fVar1 = *(float *)((long)pvVar25->data + (long)local_17c8 * 4);
            fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                              (long)local_17c8 * 4);
            local_17dc = 0;
            auVar13 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar1),0x20);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar1),0x30);
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x30);
            uStack_1d0 = auVar11._0_8_;
            uStack_1c8 = auVar11._8_8_;
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar2),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar2),0x30);
            auVar12 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0x10);
            auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar2),0x20);
            auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar2),0x30);
            uStack_190 = auVar11._0_8_;
            uStack_188 = auVar11._8_8_;
            for (; local_17dc + 7 < iVar27; local_17dc = local_17dc + 8) {
              auVar19._16_8_ = uStack_1d0;
              auVar19._0_16_ = auVar13;
              auVar19._24_8_ = uStack_1c8;
              auVar18._16_8_ = uStack_190;
              auVar18._0_16_ = auVar12;
              auVar18._24_8_ = uStack_188;
              auVar11 = vfmadd213ps_fma(auVar19,*local_17d0,auVar18);
              local_1840 = auVar11._0_8_;
              uStack_1838 = auVar11._8_8_;
              *(undefined8 *)*local_17d0 = local_1840;
              *(undefined8 *)(*local_17d0 + 8) = uStack_1838;
              *(undefined8 *)(*local_17d0 + 0x10) = 0;
              *(undefined8 *)(*local_17d0 + 0x18) = 0;
              local_17d0 = local_17d0 + 1;
            }
            for (; local_17dc < iVar27; local_17dc = local_17dc + 1) {
              *(float *)*local_17d0 = *(float *)*local_17d0 * fVar1 + fVar2;
              local_17d0 = (undefined1 (*) [32])(*local_17d0 + 4);
            }
          }
        }
      }
      if (iVar6 == 3) {
        iVar27 = iVar27 * iVar4;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
          for (local_1994 = 0; local_1994 < iVar5; local_1994 = local_1994 + 1) {
            local_19a0 = (float *)((long)pvVar24->data +
                                  pvVar24->cstep * (long)local_1994 * pvVar24->elemsize);
            fVar1 = *(float *)((long)pvVar25->data + (long)local_1994 * 4);
            local_19f0 = 0;
            auVar13 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar1),0x20);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar1),0x30);
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x30);
            for (; local_19f0 + 7 < iVar27; local_19f0 = local_19f0 + 8) {
              local_f20 = (float)*(undefined8 *)local_19a0;
              fStack_f1c = (float)((ulong)*(undefined8 *)local_19a0 >> 0x20);
              fStack_f18 = (float)*(undefined8 *)(local_19a0 + 2);
              fStack_f14 = (float)((ulong)*(undefined8 *)(local_19a0 + 2) >> 0x20);
              fStack_f10 = (float)*(undefined8 *)(local_19a0 + 4);
              fStack_f0c = (float)((ulong)*(undefined8 *)(local_19a0 + 4) >> 0x20);
              fStack_f08 = (float)*(undefined8 *)(local_19a0 + 6);
              uStack_f04 = (undefined4)((ulong)*(undefined8 *)(local_19a0 + 6) >> 0x20);
              local_f40 = auVar11._0_4_;
              fStack_f3c = auVar11._4_4_;
              fStack_f38 = auVar11._8_4_;
              fStack_f34 = auVar11._12_4_;
              fStack_f30 = auVar13._0_4_;
              fStack_f2c = auVar13._4_4_;
              fStack_f28 = auVar13._8_4_;
              local_1a40 = CONCAT44(fStack_f1c * fStack_f3c,local_f20 * local_f40);
              uStack_1a38 = CONCAT44(fStack_f14 * fStack_f34,fStack_f18 * fStack_f38);
              uStack_1a30 = CONCAT44(fStack_f0c * fStack_f2c,fStack_f10 * fStack_f30);
              uStack_1a28 = CONCAT44(uStack_f04,fStack_f08 * fStack_f28);
              *(undefined8 *)local_19a0 = local_1a40;
              *(undefined8 *)(local_19a0 + 2) = uStack_1a38;
              *(undefined8 *)(local_19a0 + 4) = uStack_1a30;
              *(undefined8 *)(local_19a0 + 6) = uStack_1a28;
              local_19a0 = local_19a0 + 8;
            }
            for (; local_19f0 < iVar27; local_19f0 = local_19f0 + 4) {
              local_9a0 = (float)*(undefined8 *)local_19a0;
              fStack_99c = (float)((ulong)*(undefined8 *)local_19a0 >> 0x20);
              fStack_998 = (float)*(undefined8 *)(local_19a0 + 2);
              fStack_994 = (float)((ulong)*(undefined8 *)(local_19a0 + 2) >> 0x20);
              local_1a60 = CONCAT44(fStack_99c * fVar1,local_9a0 * fVar1);
              uStack_1a58 = CONCAT44(fStack_994 * fVar1,fStack_998 * fVar1);
              *(undefined8 *)local_19a0 = local_1a60;
              *(undefined8 *)(local_19a0 + 2) = uStack_1a58;
              local_19a0 = local_19a0 + 4;
            }
            for (; local_19f0 < iVar27; local_19f0 = local_19f0 + 1) {
              *local_19a0 = fVar1 * *local_19a0;
              local_19a0 = local_19a0 + 1;
            }
          }
        }
        else {
          for (local_18a8 = 0; local_18a8 < iVar5; local_18a8 = local_18a8 + 1) {
            local_18b0 = (undefined1 (*) [32])
                         ((long)pvVar24->data +
                         pvVar24->cstep * (long)local_18a8 * pvVar24->elemsize);
            fVar1 = *(float *)((long)pvVar25->data + (long)local_18a8 * 4);
            local_1900 = 0;
            auVar13 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar1),0x20);
            auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar1),0x30);
            auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar1),0x30);
            uStack_110 = auVar11._0_8_;
            uStack_108 = auVar11._8_8_;
            uVar23 = *(uint *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                              (long)local_18a8 * 4);
            auVar11 = vinsertps_avx(ZEXT416(uVar23),ZEXT416(uVar23),0x10);
            auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar23),0x20);
            auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar23),0x30);
            auVar12 = vinsertps_avx(ZEXT416(uVar23),ZEXT416(uVar23),0x10);
            auVar12 = vinsertps_avx(auVar12,ZEXT416(uVar23),0x20);
            auVar12 = vinsertps_avx(auVar12,ZEXT416(uVar23),0x30);
            uStack_d0 = auVar11._0_8_;
            uStack_c8 = auVar11._8_8_;
            for (; local_1900 + 7 < iVar27; local_1900 = local_1900 + 8) {
              auVar21._16_8_ = uStack_110;
              auVar21._0_16_ = auVar13;
              auVar21._24_8_ = uStack_108;
              auVar20._16_8_ = uStack_d0;
              auVar20._0_16_ = auVar12;
              auVar20._24_8_ = uStack_c8;
              auVar11 = vfmadd213ps_fma(auVar21,*local_18b0,auVar20);
              local_1960 = auVar11._0_8_;
              uStack_1958 = auVar11._8_8_;
              *(undefined8 *)*local_18b0 = local_1960;
              *(undefined8 *)(*local_18b0 + 8) = uStack_1958;
              *(undefined8 *)(*local_18b0 + 0x10) = 0;
              *(undefined8 *)(*local_18b0 + 0x18) = 0;
              local_18b0 = local_18b0 + 1;
            }
            auVar11._4_4_ = fVar1;
            auVar11._0_4_ = fVar1;
            auVar11._12_4_ = fVar1;
            auVar11._8_4_ = fVar1;
            uVar3 = *(undefined4 *)
                     (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                     (long)local_18a8 * 4);
            auVar13._4_4_ = uVar3;
            auVar13._0_4_ = uVar3;
            auVar13._12_4_ = uVar3;
            auVar13._8_4_ = uVar3;
            for (; local_1900 < iVar27; local_1900 = local_1900 + 4) {
              auVar12 = vfmadd213ps_fma(auVar11,*(undefined1 (*) [16])*local_18b0,auVar13);
              local_1990 = auVar12._0_8_;
              uStack_1988 = auVar12._8_8_;
              *(undefined8 *)*local_18b0 = local_1990;
              *(undefined8 *)(*local_18b0 + 8) = uStack_1988;
              local_18b0 = (undefined1 (*) [32])(*local_18b0 + 0x10);
            }
            for (; local_1900 < iVar27; local_1900 = local_1900 + 1) {
              *(float *)*local_18b0 =
                   *(float *)*local_18b0 * fVar1 +
                   *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120) +
                             (long)local_18a8 * 4);
              local_18b0 = (undefined1 (*) [32])(*local_18b0 + 4);
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86_fma::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int channels = bottom_top_blob.c;
    const int dims = bottom_top_blob.dims;

    const int elempack = bottom_top_blob.elempack;

    const float* scale = scale_blob;
    const float* bias = bias_data;

    if (dims == 1)
    {
        float* ptr = (float*)bottom_top_blob;
        int size = w * elempack;

        int remain = size;
#if __SSE2__
#if __AVX__
        int nn = size >> 3;
        remain = size & 7;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < nn; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr + i * 8);
            __m256 _s = _mm256_loadu_ps(scale + i * 8);
            if (bias_term)
            {
                __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
            }
            else
            {
                _p = _mm256_mul_ps(_p, _s);
            }
            _mm256_storeu_ps(ptr + i * 8, _p);
        }
#else
        int nn = size >> 2;
        remain = size & 3;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < nn; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr + i * 4);
            __m128 _s = _mm_loadu_ps(scale + i * 4);
            if (bias_term)
            {
                __m128 _bias = _mm_loadu_ps(bias + i * 4);
                _p = _mm_comp_fmadd_ps(_p, _s, _bias);
            }
            else
            {
                _p = _mm_mul_ps(_p, _s);
            }
            _mm_storeu_ps(ptr + i * 4, _p);
        }
#endif // __AVX__
#endif // __SSE2__
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = size - remain; i < size; i++)
        {
            if (bias_term)
            {
                ptr[i] = ptr[i] * scale[i] + bias[i];
            }
            else
            {
                ptr[i] = ptr[i] * scale[i];
            }
        }

        return 0;
    }

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 2)
        {
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }
        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 2)
        {
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 2)
        {
            int size = w;
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);

                    float s = scale_blob[i];
                    float bias = bias_data[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s = _mm256_set1_ps(s);
                    __m256 _bias = _mm256_set1_ps(bias);

                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#else
                    __m128 _s = _mm_set1_ps(s);
                    __m128 _bias = _mm_set1_ps(bias);

                    for (; j + 3 < size; j += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _s, _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __AVX__
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr = *ptr * s + bias;

                        ptr++;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s = _mm256_set1_ps(s);

                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#else
                    __m128 _s = _mm_set1_ps(s);

                    for (; j + 3 < size; j += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __AVX__
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr *= s;

                        ptr++;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int size = w * h;
            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < channels; i++)
                {
                    float* ptr = bottom_top_blob.channel(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s256 = _mm256_set1_ps(s);
                    __m256 _bias256 = _mm256_set1_ps(bias_data[i]);
                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s256, _bias256);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _s128 = _mm_set1_ps(s);
                    __m128 _bias128 = _mm_set1_ps(bias_data[i]);
                    for (; j < size; j += 4)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _s128, _bias128);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr = *ptr * s + bias_data[i];
                        ptr++;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < channels; i++)
                {
                    float* ptr = bottom_top_blob.channel(i);

                    float s = scale_blob[i];

                    int j = 0;
#if __SSE2__
#if __AVX__
                    __m256 _s256 = _mm256_set1_ps(s);
                    for (; j + 7 < size; j += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s256);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
#endif // __AVX__

                    __m128 _s128 = _mm_set1_ps(s);
                    for (; j < size; j += 4)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _s128);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
#endif // __SSE2__

                    for (; j < size; j++)
                    {
                        *ptr *= s;
                        ptr++;
                    }
                }
            }
        }
    }

    return 0;
}